

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc,int mask)

{
  AuxData *pAVar1;
  AuxData *pAux;
  int i;
  int mask_local;
  VdbeFunc *pVdbeFunc_local;
  
  for (pAux._0_4_ = 0; (int)pAux < pVdbeFunc->nAux; pAux._0_4_ = (int)pAux + 1) {
    pAVar1 = pVdbeFunc->apAux + (int)pAux;
    if (((0x1f < (int)pAux) || ((mask & 1 << ((byte)(int)pAux & 0x1f)) == 0)) &&
       (pAVar1->pAux != (void *)0x0)) {
      if (pAVar1->xDelete != (_func_void_void_ptr *)0x0) {
        (*pAVar1->xDelete)(pAVar1->pAux);
      }
      pAVar1->pAux = (void *)0x0;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeDeleteAuxData(VdbeFunc *pVdbeFunc, int mask){
  int i;
  for(i=0; i<pVdbeFunc->nAux; i++){
    struct AuxData *pAux = &pVdbeFunc->apAux[i];
    if( (i>31 || !(mask&(((u32)1)<<i))) && pAux->pAux ){
      if( pAux->xDelete ){
        pAux->xDelete(pAux->pAux);
      }
      pAux->pAux = 0;
    }
  }
}